

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

void create_netconfig(TadsNetConfig **c,char **argv)

{
  TadsNetConfig *pTVar1;
  FILE *pFVar2;
  CVmMainClientIfcStdio ifc;
  char confname [4096];
  char confpath [4096];
  
  if (*c != (TadsNetConfig *)0x0) {
    return;
  }
  pTVar1 = (TadsNetConfig *)operator_new(0x10);
  pTVar1->first_var = (TadsNetConfigVar *)0x0;
  pTVar1->last_var = (TadsNetConfigVar *)0x0;
  *c = pTVar1;
  os_get_special_path(confpath,0x1000,*argv,6);
  os_build_full_path(confname,0x1000,confpath,"tadsweb.config");
  pFVar2 = fopen(confname,"rb");
  if (pFVar2 == (FILE *)0x0) {
    fprintf(_stderr,"Warning: -webhost mode specified, but couldn\'t read web config file \"%s\"\n",
            confname);
  }
  else {
    ifc.super_CVmMainClientIfc._vptr_CVmMainClientIfc =
         (CVmMainClientIfc)&PTR__CVmMainClientIfc_00341e60;
    TadsNetConfig::read(*c,(int)pFVar2,&ifc,0x341e60);
  }
  return;
}

Assistant:

static void
create_netconfig( TadsNetConfig*& c, const char* const* argv)
{
    // If we don't have a network config object yet, create it.
    if (c == 0) {
        // Create a new config object.
        // We don't manage this; the VM will call delete on it.
        c = new TadsNetConfig();
        
        // Get the path to the network config file.
        char confname[OSFNMAX], confpath[OSFNMAX];
        os_get_special_path(confpath, sizeof(confpath), argv[0],
                            OS_GSP_T3_SYSCONFIG);
        os_build_full_path(confname, sizeof(confname),
                           confpath, "tadsweb.config");
        
        // If the config file exists, load it.
        osfildef* fp = osfoprb(confname, OSFTTEXT);
        if (fp != 0) {
            // Read the file.
            CVmMainClientIfcStdio ifc;
            c->read(fp, &ifc);
        } else {
            // Warn that the file is missing.
            fprintf(stderr, "Warning: -webhost mode specified, but couldn't "
                    "read web config file \"%s\"\n", confname);
        }
    }
}